

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afdummy.c
# Opt level: O0

FT_Error af_dummy_hints_init(AF_GlyphHints hints,AF_StyleMetrics_conflict metrics)

{
  AF_StyleMetrics_conflict metrics_local;
  AF_GlyphHints hints_local;
  
  af_glyph_hints_rescale(hints,metrics);
  hints->x_scale = (metrics->scaler).x_scale;
  hints->y_scale = (metrics->scaler).y_scale;
  hints->x_delta = (metrics->scaler).x_delta;
  hints->y_delta = (metrics->scaler).y_delta;
  return 0;
}

Assistant:

static FT_Error
  af_dummy_hints_init( AF_GlyphHints    hints,
                       AF_StyleMetrics  metrics )
  {
    af_glyph_hints_rescale( hints, metrics );

    hints->x_scale = metrics->scaler.x_scale;
    hints->y_scale = metrics->scaler.y_scale;
    hints->x_delta = metrics->scaler.x_delta;
    hints->y_delta = metrics->scaler.y_delta;

    return FT_Err_Ok;
  }